

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

uint32 __thiscall Protocol::MQTT::V5::WillMessage::copyInto(WillMessage *this,uint8 *buffer)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long *plVar6;
  
  memcpy(buffer,this + 0x18,(ulong)*(ushort *)(this + 0x1c));
  uVar5 = (ulong)*(ushort *)(this + 0x1c);
  for (plVar6 = *(long **)(this + 0x20); iVar4 = (int)uVar5, plVar6 != (long *)0x0;
      plVar6 = (long *)plVar6[2]) {
    iVar3 = (**(code **)(*plVar6 + 8))(plVar6,buffer + uVar5);
    uVar5 = (ulong)(uint)(iVar4 + iVar3);
  }
  uVar1 = *(ushort *)(this + 0x40);
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar1 = uVar1 << 8 | uVar1 >> 8;
    }
    else {
      uVar1 = 0;
    }
  }
  *(ushort *)(buffer + uVar5) = uVar1;
  memcpy((ushort *)((long)(buffer + uVar5) + 2),*(void **)(this + 0x42),
         (ulong)*(ushort *)(this + 0x40));
  uVar1 = *(ushort *)(this + 0x40);
  uVar2 = *(ushort *)(this + 0x5a);
  if (BigEndian(unsigned_short)::signature != '\x01') {
    if (BigEndian(unsigned_short)::signature == '\x04') {
      uVar2 = uVar2 << 8 | uVar2 >> 8;
    }
    else {
      uVar2 = 0;
    }
  }
  *(ushort *)(buffer + (ulong)((uint)uVar1 + iVar4 + 2) + 2 + -2) = uVar2;
  memcpy(buffer + (ulong)((uint)uVar1 + iVar4 + 2) + 2,*(void **)(this + 0x5c),
         (ulong)*(ushort *)(this + 0x5a));
  return (uint)*(ushort *)(this + 0x5a) + iVar4 + (uint)uVar1 + 4;
}

Assistant:

virtual uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = willProperties.copyInto(buffer);
                    o += willTopic.copyInto(buffer+o);
                    o += willPayload.copyInto(buffer+o);
                    return o;
                }